

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vi.c
# Opt level: O2

el_action_t vi_history_word(EditLine *el,wint_t c)

{
  wchar_t wVar1;
  int iVar2;
  wchar_t *pwVar3;
  wchar_t *pwVar4;
  el_action_t eVar5;
  wchar_t *pwVar6;
  wchar_t *pwVar7;
  wchar_t *pwVar8;
  
  if ((el->el_flags & L'@') == L'\0') {
    wVar1 = (*(el->el_history).fun)((el->el_history).ref,&(el->el_history).ev,L'\x03',0);
    if (wVar1 == L'\xffffffff') {
      return '\x06';
    }
    pwVar3 = (el->el_history).ev.str;
  }
  else {
    pwVar3 = hist_convert(el,L'\x03',(void *)0x0);
  }
  eVar5 = '\x06';
  if (pwVar3 != (wchar_t *)0x0) {
    pwVar6 = (wchar_t *)0x0;
    pwVar8 = (wchar_t *)0x0;
    while( true ) {
      pwVar7 = pwVar3 + -1;
      do {
        pwVar4 = pwVar3;
        pwVar3 = pwVar7 + 1;
        pwVar7 = pwVar7 + 1;
        iVar2 = iswspace(*pwVar3);
        pwVar3 = pwVar4 + 1;
      } while (iVar2 != 0);
      wVar1 = *pwVar7;
      pwVar3 = pwVar7;
      if (wVar1 == L'\0') break;
      while ((wVar1 != L'\0' && (iVar2 = iswspace(wVar1), iVar2 == 0))) {
        wVar1 = pwVar3[1];
        pwVar3 = pwVar3 + 1;
      }
      pwVar8 = pwVar3;
      if ((((el->el_state).doingarg != L'\0') &&
          (wVar1 = (el->el_state).argument, (el->el_state).argument = wVar1 + L'\xffffffff',
          pwVar6 = pwVar4, wVar1 < L'\x02')) || (pwVar6 = pwVar7, *pwVar3 == L'\0')) break;
    }
    if ((pwVar6 != (wchar_t *)0x0) &&
       (((el->el_state).doingarg == L'\0' || ((el->el_state).argument == L'\0')))) {
      cv_undo(el);
      pwVar3 = (el->el_line).cursor;
      if (pwVar3 < (el->el_line).lastchar) {
        (el->el_line).cursor = pwVar3 + 1;
      }
      c_insert(el,(int)((ulong)((long)pwVar8 - (long)pwVar6) >> 2) + L'\x01');
      pwVar3 = (el->el_line).cursor;
      pwVar7 = (el->el_line).limit;
      if (pwVar7 <= pwVar3) goto LAB_00113efa;
      *pwVar3 = L' ';
      while( true ) {
        pwVar3 = pwVar3 + 1;
LAB_00113efa:
        if ((pwVar8 <= pwVar6) || (pwVar7 <= pwVar3)) break;
        wVar1 = *pwVar6;
        pwVar6 = pwVar6 + 1;
        *pwVar3 = wVar1;
      }
      (el->el_line).cursor = pwVar3;
      (el->el_map).current = (el->el_map).key;
      eVar5 = '\x04';
    }
  }
  return eVar5;
}

Assistant:

libedit_private el_action_t
/*ARGSUSED*/
vi_history_word(EditLine *el, wint_t c __attribute__((__unused__)))
{
	const wchar_t *wp = HIST_FIRST(el);
	const wchar_t *wep, *wsp;
	int len;
	wchar_t *cp;
	const wchar_t *lim;

	if (wp == NULL)
		return CC_ERROR;

	wep = wsp = NULL;
	do {
		while (iswspace(*wp))
			wp++;
		if (*wp == 0)
			break;
		wsp = wp;
		while (*wp && !iswspace(*wp))
			wp++;
		wep = wp;
	} while ((!el->el_state.doingarg || --el->el_state.argument > 0)
	    && *wp != 0);

	if (wsp == NULL || (el->el_state.doingarg && el->el_state.argument != 0))
		return CC_ERROR;

	cv_undo(el);
	len = (int)(wep - wsp);
	if (el->el_line.cursor < el->el_line.lastchar)
		el->el_line.cursor++;
	c_insert(el, len + 1);
	cp = el->el_line.cursor;
	lim = el->el_line.limit;
	if (cp < lim)
		*cp++ = ' ';
	while (wsp < wep && cp < lim)
		*cp++ = *wsp++;
	el->el_line.cursor = cp;

	el->el_map.current = el->el_map.key;
	return CC_REFRESH;
}